

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

rect2d __thiscall rengine::rect2d::aligned(rect2d *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  rect2d rVar4;
  
  fVar1 = (this->tl).y;
  rVar4.tl.x = floorf((this->tl).x);
  fVar1 = floorf(fVar1);
  fVar2 = ceilf((this->br).x);
  fVar3 = ceilf((this->br).y);
  rVar4.br.y = fVar3;
  rVar4.br.x = fVar2;
  rVar4.tl.y = fVar1;
  return rVar4;
}

Assistant:

rect2d aligned() const {
        return rect2d(std::floor(tl.x), std::floor(tl.y),
                      std::ceil(br.x), std::ceil(br.y));
    }